

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O1

void __thiscall webrtc::AecCore::AecCore(AecCore *this)

{
  this->sampFreq = 16000;
  BlockMeanCalculator::BlockMeanCalculator(&(this->farlevel).framelevel,5);
  BlockMeanCalculator::BlockMeanCalculator(&(this->farlevel).averagelevel,0x33);
  BlockMeanCalculator::BlockMeanCalculator(&(this->nearlevel).framelevel,5);
  BlockMeanCalculator::BlockMeanCalculator(&(this->nearlevel).averagelevel,0x33);
  BlockMeanCalculator::BlockMeanCalculator(&(this->linoutlevel).framelevel,5);
  BlockMeanCalculator::BlockMeanCalculator(&(this->linoutlevel).averagelevel,0x33);
  BlockMeanCalculator::BlockMeanCalculator(&(this->nlpoutlevel).framelevel,5);
  BlockMeanCalculator::BlockMeanCalculator(&(this->nlpoutlevel).averagelevel,0x33);
  (this->divergent_filter_fraction).count_ = 0;
  (this->divergent_filter_fraction).occurrence_ = 0;
  (this->divergent_filter_fraction).fraction_ = -1.0;
  return;
}

Assistant:

AecCore::AecCore() = default;